

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book_perf_test.cc
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  order_book ob;
  allocator local_119;
  string local_118;
  order_book local_f8;
  
  std::__cxx11::string::string((string *)&local_118,"AXP",&local_119);
  helix::order_book::order_book(&local_f8,&local_118,0,20000000);
  std::__cxx11::string::~string((string *)&local_118);
  test_add(&local_f8,20000000);
  test_cancel(&local_f8,20000000);
  test_remove(&local_f8,20000000);
  poVar1 = std::operator<<((ostream *)&std::cout,"order_book::add()    ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," ns/op");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"order_book::cancel() ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," ns/op");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"order_book::remove() ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," ns/op");
  std::endl<char,std::char_traits<char>>(poVar1);
  helix::order_book::~order_book(&local_f8);
  return 0;
}

Assistant:

int main()
{
    unsigned long count = 20000000;

    order_book ob{"AXP", 0, count};
    auto add_duration = test_add(ob, count);
    auto cancel_duration = test_cancel(ob, count);
    auto remove_duration = test_remove(ob, count);

    std::cout << "order_book::add()    " << std::chrono::duration_cast<std::chrono::nanoseconds>(add_duration).count() / count << " ns/op" << std::endl;
    std::cout << "order_book::cancel() " << std::chrono::duration_cast<std::chrono::nanoseconds>(cancel_duration).count() / count << " ns/op" << std::endl;
    std::cout << "order_book::remove() " << std::chrono::duration_cast<std::chrono::nanoseconds>(remove_duration).count() / count << " ns/op" << std::endl;
}